

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

void __thiscall printable_vtable::~printable_vtable(printable_vtable *this)

{
  value_type p_Var1;
  bool bVar2;
  reference pp_Var3;
  void *pvVar4;
  delete_wrapper_type delete_impl;
  printable_vtable *this_local;
  
  bVar2 = heap_allocated(this);
  if (bVar2) {
    pp_Var3 = std::array<void_(*)(),_3UL>::operator[](&this->vtable_,1);
    p_Var1 = *pp_Var3;
    pvVar4 = (*this->get_value_ptr_)(this);
    (*p_Var1)(pvVar4);
  }
  return;
}

Assistant:

~printable_vtable ()
    {
        if (heap_allocated()) {
            delete_wrapper_type delete_impl = (delete_wrapper_type)(vtable_[1]);
            delete_impl(get_value_ptr_(this));
        }
    }